

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O2

void kill_dead_stores(dmr_C *C,pseudo_t pseudo,unsigned_long generation,basic_block *bb,int local)

{
  byte bVar1;
  pseudo_t ppVar2;
  instruction *insn;
  basic_block *bb_00;
  basic_block *pbVar3;
  undefined1 local_70 [8];
  ptr_list_iter childiter__;
  ptr_list_iter insniter__;
  
  if (bb->generation != generation) {
    bb->generation = generation;
    ptrlist_reverse_iterator((ptr_list_iter *)&childiter__.__nr,(ptr_list *)bb->insns);
    do {
      while( true ) {
        while( true ) {
          insn = (instruction *)ptrlist_iter_prev((ptr_list_iter *)&childiter__.__nr);
          if (insn == (instruction *)0x0) {
            ptrlist_forward_iterator((ptr_list_iter *)&childiter__.__nr,(ptr_list *)bb->parents);
            do {
              bb_00 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&childiter__.__nr);
              if (bb_00 == (basic_block *)0x0) {
                return;
              }
              ptrlist_forward_iterator((ptr_list_iter *)local_70,(ptr_list *)bb_00->children);
              while (pbVar3 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_70),
                    pbVar3 != (basic_block *)0x0) {
                if (pbVar3 != bb) {
                  return;
                }
              }
              kill_dead_stores(C,pseudo,generation,bb_00,local);
            } while( true );
          }
          bVar1 = *(byte *)insn;
          if (0xfffffffd < bVar1 - 0x2b) break;
          if ((local == 0) && (bVar1 == 0x35)) {
            return;
          }
        }
        ppVar2 = (insn->field_6).field_4.phi_src;
        if (ppVar2 != pseudo) break;
        if (bVar1 == 0x29) {
          return;
        }
        kill_store(C,insn);
      }
    } while ((local != 0) || (ppVar2->type == PSEUDO_SYM));
  }
  return;
}

Assistant:

static void kill_dead_stores(struct dmr_C *C, pseudo_t pseudo, unsigned long generation, struct basic_block *bb, int local)
{
	struct instruction *insn;
	struct basic_block *parent;

	if (bb->generation == generation)
		return;
	bb->generation = generation;
	FOR_EACH_PTR_REVERSE(bb->insns, insn) {
		int opcode = insn->opcode;

		if (opcode != OP_LOAD && opcode != OP_STORE) {
			if (local)
				continue;
			if (opcode == OP_CALL)
				return;
			continue;
		}
		if (insn->src == pseudo) {
			if (opcode == OP_LOAD)
				return;
			kill_store(C, insn);
			continue;
		}
		if (local)
			continue;
		if (insn->src->type != PSEUDO_SYM)
			return;
	} END_FOR_EACH_PTR_REVERSE(insn);

	FOR_EACH_PTR(bb->parents, parent) {
		struct basic_block *child;
		FOR_EACH_PTR(parent->children, child) {
			if (child && child != bb)
				return;
		} END_FOR_EACH_PTR(child);
		kill_dead_stores(C, pseudo, generation, parent, local);
	} END_FOR_EACH_PTR(parent);
}